

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnf.hpp
# Opt level: O1

void __thiscall bal::Cnf::append_clause(Cnf *this,literalid_t *literals,clause_size_t literals_size)

{
  uint uVar1;
  uint uVar2;
  clause_size_t cVar3;
  uint *puVar4;
  undefined6 in_register_00000012;
  uint uVar5;
  uint32_t *literals_00;
  insertion_point_t l0_insertion_point;
  insertion_point_t local_40;
  
  uVar1 = (this->clauses_).allocated_size_;
  uVar2 = (uint)CONCAT62(in_register_00000012,literals_size);
  uVar5 = uVar2 + (this->clauses_).size_ + 1;
  if ((uVar5 <= uVar1) || (uVar5 = uVar5 + (uVar1 >> 1), uVar1 == uVar5)) goto LAB_0010b346;
  puVar4 = (this->clauses_).data_;
  if (puVar4 == (uint *)0x0) {
    if (uVar5 != 0) {
      puVar4 = (uint *)malloc((ulong)uVar5 << 2);
      (this->clauses_).data_ = puVar4;
      if (puVar4 == (uint *)0x0) {
        __assert_fail("data_ != nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/vsklad[P]cgraph/bal/base/container.hpp"
                      ,0x37,
                      "void bal::Container<unsigned int>::resize_(const container_size_t) [T = unsigned int]"
                     );
      }
    }
LAB_0010b33c:
    (this->clauses_).size_ = 0;
  }
  else {
    if (uVar5 == 0) {
      free(puVar4);
      (this->clauses_).data_ = (uint *)0x0;
      goto LAB_0010b33c;
    }
    puVar4 = (uint *)realloc(puVar4,(ulong)uVar5 << 2);
    if (puVar4 == (uint *)0x0) {
      __assert_fail("new_data != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/vsklad[P]cgraph/bal/base/container.hpp"
                    ,0x32,
                    "void bal::Container<unsigned int>::resize_(const container_size_t) [T = unsigned int]"
                   );
    }
    (this->clauses_).data_ = puVar4;
  }
  (this->clauses_).allocated_size_ = uVar5;
LAB_0010b346:
  puVar4 = (this->clauses_).data_;
  puVar4[(this->clauses_).size_] = uVar2;
  literals_00 = puVar4 + (ulong)(this->clauses_).size_ + 1;
  if (literals_size != 0) {
    memmove(literals_00,literals,(ulong)((uint)literals_size * 4));
  }
  cVar3 = normalize_clause(literals_00,literals_size);
  (this->clauses_).data_[(this->clauses_).size_] = (uint)cVar3;
  local_40.super_container_index_insertion_point_t.version_stamp = 0xffffffff;
  __append_clause<false>(this,&local_40);
  return;
}

Assistant:

inline void append_clause(const literalid_t* const literals, const clause_size_t literals_size) {
            clauses_.reserve(literals_size + 1);
            clauses_.data_[clauses_.size_] = literals_size; // no flags
            literalid_t* const dst_literals = clauses_.data_ + clauses_.size_ + 1;
            std::copy(literals, literals + literals_size, dst_literals);
            clauses_.data_[clauses_.size_] = normalize_clause(dst_literals, literals_size);
            l0_index_t::insertion_point_t l0_insertion_point;
            __insertion_point_t_init(l0_insertion_point);
            __append_clause<false>(l0_insertion_point);
        }